

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool blobcmp(curl_blob *first,curl_blob *second)

{
  int iVar1;
  _Bool _Var2;
  
  _Var2 = true;
  if (first != (curl_blob *)0x0 || second != (curl_blob *)0x0) {
    if ((first == (curl_blob *)0x0 || second == (curl_blob *)0x0) || (first->len != second->len)) {
      return false;
    }
    iVar1 = bcmp(first->data,second->data,first->len);
    _Var2 = iVar1 == 0;
  }
  return _Var2;
}

Assistant:

static bool blobcmp(struct curl_blob *first, struct curl_blob *second)
{
  if(!first && !second) /* both are NULL */
    return TRUE;
  if(!first || !second) /* one is NULL */
    return FALSE;
  if(first->len != second->len) /* different sizes */
    return FALSE;
  return !memcmp(first->data, second->data, first->len); /* same data */
}